

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::CodedInputStream::ReadCord(CodedInputStream *this,Cord *output,int size)

{
  uint8_t *__str;
  string_view src;
  uint uVar1;
  int iVar2;
  Cord **v1;
  void **v2;
  char *failure_msg;
  LogMessage *pLVar3;
  int *piVar4;
  size_type sVar5;
  int available;
  int closest_limit;
  int local_74;
  undefined1 local_70 [8];
  string_view buffer;
  LogMessage local_50;
  Voidify local_39;
  void *local_38;
  Nullable<const_char_*> local_30;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Cord *pCStack_20;
  int size_local;
  Cord *output_local;
  CodedInputStream *this_local;
  
  absl_log_internal_check_op_result._4_4_ = size;
  pCStack_20 = output;
  output_local = (Cord *)this;
  v1 = absl::lts_20250127::log_internal::GetReferenceableValue<absl::lts_20250127::Cord*>
                 (&stack0xffffffffffffffe0);
  local_38 = (void *)0x0;
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue<decltype(nullptr)>(&local_38);
  local_30 = absl::lts_20250127::log_internal::
             Check_NEImpl<absl::lts_20250127::Cord*,decltype(nullptr)>(v1,v2,"output != nullptr");
  if (local_30 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_30);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.cc"
               ,0x134,failure_msg);
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_39,pLVar3);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_50);
  }
  if ((int)absl_log_internal_check_op_result._4_4_ < 0) {
    absl::lts_20250127::Cord::Clear(pCStack_20);
    return false;
  }
  if ((this->input_ == (ZeroCopyInputStream *)0x0) ||
     ((int)absl_log_internal_check_op_result._4_4_ < 0x200)) {
    __str = this->buffer_;
    local_74 = BufferSize(this);
    piVar4 = std::min<int>((int *)((long)&absl_log_internal_check_op_result + 4),&local_74);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)local_70,(char *)__str,
               (long)*piVar4);
    src._M_str = (char *)buffer._M_len;
    src._M_len = (size_t)local_70;
    absl::lts_20250127::Cord::operator=(pCStack_20,src);
    sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_70);
    Advance(this,(int)sVar5);
    sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_70);
    absl_log_internal_check_op_result._4_4_ = absl_log_internal_check_op_result._4_4_ - (int)sVar5;
    if (absl_log_internal_check_op_result._4_4_ == 0) {
      return true;
    }
    if ((this->input_ == (ZeroCopyInputStream *)0x0) ||
       (0 < this->buffer_size_after_limit_ + this->overflow_bytes_)) {
      return false;
    }
  }
  else {
    absl::lts_20250127::Cord::Clear(pCStack_20);
    BackUpInputToCurrentPosition(this);
  }
  piVar4 = std::min<int>(&this->current_limit_,&this->total_bytes_limit_);
  uVar1 = *piVar4 - this->total_bytes_read_;
  if ((int)uVar1 < (int)absl_log_internal_check_op_result._4_4_) {
    this->total_bytes_read_ = *piVar4;
    (*this->input_->_vptr_ZeroCopyInputStream[6])(this->input_,pCStack_20,(ulong)uVar1);
    this_local._7_1_ = false;
  }
  else {
    this->total_bytes_read_ = absl_log_internal_check_op_result._4_4_ + this->total_bytes_read_;
    iVar2 = (*this->input_->_vptr_ZeroCopyInputStream[6])
                      (this->input_,pCStack_20,(ulong)absl_log_internal_check_op_result._4_4_);
    this_local._7_1_ = (bool)((byte)iVar2 & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool CodedInputStream::ReadCord(absl::Cord* output, int size) {
  ABSL_DCHECK_NE(output, nullptr);

  // security: size is often user-supplied
  if (size < 0) {
    output->Clear();
    return false;  // security: size is often user-supplied
  }

  // Grab whatever is in the current output if `size` is relatively small,
  // or if we are not sourcing data from an input stream.
  if (input_ == nullptr || size < kMaxCordBytesToCopy) {
    // Just copy the current buffer into the output rather than backing up.
    absl::string_view buffer(reinterpret_cast<const char*>(buffer_),
                             static_cast<size_t>(std::min(size, BufferSize())));
    *output = buffer;
    Advance(static_cast<int>(buffer.size()));
    size -= static_cast<int>(buffer.size());
    if (size == 0) return true;
    if (input_ == nullptr || buffer_size_after_limit_ + overflow_bytes_ > 0) {
      // We hit a limit.
      return false;
    }
  } else {
    output->Clear();
    BackUpInputToCurrentPosition();
  }

  // Make sure to not cross a limit set by PushLimit() or SetTotalBytesLimit().
  const int closest_limit = std::min(current_limit_, total_bytes_limit_);
  const int available = closest_limit - total_bytes_read_;
  if (ABSL_PREDICT_FALSE(size > available)) {
    total_bytes_read_ = closest_limit;
    input_->ReadCord(output, available);
    return false;
  }
  total_bytes_read_ += size;
  return input_->ReadCord(output, size);
}